

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fix_storage_class.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::FixStorageClass::ChangeResultType
          (FixStorageClass *this,Instruction *inst,uint32_t new_type_id)

{
  uint32_t uVar1;
  
  uVar1 = Instruction::type_id(inst);
  if (uVar1 != new_type_id) {
    IRContext::ForgetUses((this->super_Pass).context_,inst);
    Instruction::SetResultType(inst,new_type_id);
    IRContext::AnalyzeUses((this->super_Pass).context_,inst);
  }
  return uVar1 != new_type_id;
}

Assistant:

bool FixStorageClass::ChangeResultType(Instruction* inst,
                                       uint32_t new_type_id) {
  if (inst->type_id() == new_type_id) {
    return false;
  }

  context()->ForgetUses(inst);
  inst->SetResultType(new_type_id);
  context()->AnalyzeUses(inst);
  return true;
}